

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O1

char * kws_search_get_keyphrases(ps_search_t *search)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  
  pcVar6 = search[1].type;
  uVar5 = 0;
  if (pcVar6 != (char *)0x0) {
    do {
      sVar2 = strlen((char *)**(undefined8 **)pcVar6);
      uVar4 = (int)uVar5 + (int)sVar2 + 1;
      uVar5 = (ulong)uVar4;
      pcVar6 = *(char **)(pcVar6 + 8);
    } while (pcVar6 != (char *)0x0);
    uVar5 = (ulong)(int)uVar4;
  }
  pcVar3 = (char *)__ckd_calloc__(uVar5,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
                                  ,0x2bd);
  pcVar6 = search[1].type;
  uVar5 = 0;
  if (pcVar6 != (char *)0x0) {
    do {
      __s = (char *)**(undefined8 **)pcVar6;
      iVar1 = (int)uVar5;
      sVar2 = strlen(__s);
      memcpy(pcVar3 + iVar1,__s,sVar2);
      sVar2 = strlen(__s);
      uVar4 = (int)sVar2 + iVar1 + 1;
      uVar5 = (ulong)uVar4;
      pcVar3[iVar1 + (int)sVar2] = '\n';
      pcVar6 = *(char **)(pcVar6 + 8);
    } while (pcVar6 != (char *)0x0);
    uVar5 = (ulong)(int)uVar4;
  }
  pcVar3[uVar5 - 1] = '\0';
  return pcVar3;
}

Assistant:

char * 
kws_search_get_keyphrases(ps_search_t * search)
{
    int c, len;
    kws_search_t *kwss;
    char* line;
    gnode_t *gn;

    kwss = (kws_search_t *) search;

    len = 0;
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn))
        len += strlen(((kws_keyphrase_t *)gnode_ptr(gn))->word) + 1;

    c = 0;
    line = (char *)ckd_calloc(len, sizeof(*line));
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn)) {
        const char *str = ((kws_keyphrase_t *)gnode_ptr(gn))->word;
        memcpy(&line[c], str, strlen(str));
        c += strlen(str);
        line[c++] = '\n';
    }
    line[--c] = '\0';

    return line;
}